

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void variance_api_suite::test_ctor(void)

{
  anon_struct_8_1_9d7123ef_for_sum *paVar1;
  bool bVar2;
  undefined1 auStack_f8 [8];
  moment_variance<double,_4> massign;
  moment_variance<double,_4> mover;
  moment_variance<double,_4> assign;
  moment_variance<double,_4> copy;
  moment_variance<double,_4> filter;
  
  paVar1 = &copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
            super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
            sum;
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)2> *)paVar1);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2> *)paVar1,1.0
            );
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2> *)
                     paVar1);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xe6,"void variance_api_suite::test_ctor()",!bVar2);
  copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2> *)
                     &assign.
                      super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>
                      .passive.sum);
  boost::detail::test_impl
            ("!copy.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xea,"void variance_api_suite::test_ctor()",!bVar2);
  paVar1 = &mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
            super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
            sum;
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)2> *)paVar1);
  assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2> *)
                     paVar1);
  boost::detail::test_impl
            ("!assign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xef,"void variance_api_suite::test_ctor()",!bVar2);
  mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2> *)
                     &massign.
                      super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>
                      .passive.sum);
  boost::detail::test_impl
            ("!mover.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xf3,"void variance_api_suite::test_ctor()",!bVar2);
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)2> *)auStack_f8);
  massign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.passive.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.sum;
  auStack_f8 = (undefined1  [8])
               mover.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>
               .super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.
               passive.sum.variance;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)2>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>.active.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)2> *)
                     auStack_f8);
  boost::detail::test_impl
            ("!massign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xf8,"void variance_api_suite::test_ctor()",(bool)(bVar2 - 1U & 1));
  return;
}

Assistant:

void test_ctor()
{
    interim::moment_variance<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST(!filter.empty());

    // Copy constructor
    interim::moment_variance<double, 4> copy(filter);
    TRIAL_TEST(!copy.empty());

    // Copy assignment
    interim::moment_variance<double, 4> assign;
    assign = filter;
    TRIAL_TEST(!assign.empty());

    // Move constructor
    interim::moment_variance<double, 4> mover(std::move(copy));
    TRIAL_TEST(!mover.empty());

    // Move assignment
    interim::moment_variance<double, 4> massign;
    massign = std::move(assign);
    TRIAL_TEST(!massign.empty());
}